

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringElement.cpp
# Opt level: O2

ssize_t __thiscall StringElement::read(StringElement *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined8 uVar1;
  undefined4 in_register_00000034;
  string tmpStr;
  
  tmpStr._M_dataplus._M_p = (pointer)&tmpStr.field_2;
  tmpStr._M_string_length = 0;
  tmpStr.field_2._M_local_buf[0] = '\0';
  std::operator>>((istream *)CONCAT44(in_register_00000034,__fd),(string *)&tmpStr);
  std::__cxx11::string::_M_assign((string *)&this->_value);
  Object::setInitState(&(this->super_StreamObject).super_Object,true);
  uVar1 = std::__cxx11::string::~string((string *)&tmpStr);
  return CONCAT71((int7)((ulong)uVar1 >> 8),1);
}

Assistant:

bool StringElement::read( std::stringstream &f )
{
	/*-----------------------------------------
		   Read string
	------------------------------------------*/

	std::string tmpStr;

	f >> tmpStr;

	_value = tmpStr;

	setInitState( true );

	return true;

}